

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTcSymLocal::gen_code_setlcl(CTcSymLocal *this)

{
  ushort uVar1;
  CTcCodeStream *this_00;
  int iVar2;
  size_t in_RCX;
  undefined1 local_1a;
  undefined1 local_19;
  
  uVar1 = *(ushort *)&(this->super_CTcSymLocalBase).field_0x64;
  if ((uVar1 & 0x10) == 0) {
    s_gen_code_setlcl_stk((this->super_CTcSymLocalBase).var_num_,uVar1 & 1);
    return;
  }
  if (((this->super_CTcSymLocalBase).ctx_var_num_ < 0x100) &&
     (iVar2 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase), iVar2 < 0x100)) {
    CTcGenTarg::write_op(G_cg,0xef);
    local_1a = (undefined1)(this->super_CTcSymLocalBase).ctx_var_num_;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_1a,(void *)0x1,in_RCX);
    this_00 = G_cs;
    iVar2 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
    local_19 = (undefined1)iVar2;
    CTcDataStream::write(&this_00->super_CTcDataStream,(int)&local_19,(void *)0x1,in_RCX);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    return;
  }
  s_gen_code_getlcl((this->super_CTcSymLocalBase).ctx_var_num_,0);
  iVar2 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
  CTPNConst::s_gen_code_int((long)iVar2);
  CTcGenTarg::write_op(G_cg,0xe4);
  CTcGenTarg::write_op(G_cg,0x89);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
  return;
}

Assistant:

void CTcSymLocal::gen_code_setlcl()
{
    /* check to see if we're a context local (as opposed to a stack local) */
    if (is_ctx_local_)
    {
        /* generate the assignment using the appropriate sequence */
        if (ctx_var_num_ <= 255 && get_ctx_arr_idx() <= 255)
        {
            /* we can fit this in a single instruction */
            G_cg->write_op(OPC_SETINDLCL1I8);
            G_cs->write((uchar)ctx_var_num_);
            G_cs->write((uchar)get_ctx_arr_idx());

            /* this pops the value being assigned */
            G_cg->note_pop();
        }
        else
        {
            /* get our context array */
            s_gen_code_getlcl(ctx_var_num_, FALSE);
            
            /* set our value in the context array */
            CTPNConst::s_gen_code_int(get_ctx_arr_idx());
            G_cg->write_op(OPC_SETIND);
            G_cg->write_op(OPC_DISC);
            
            /* 
             *   the SETIND pops three values and pushes one (for a net two
             *   pops), and the DISC pops one more value, so our total is
             *   three pops 
             */
            G_cg->note_pop(3);
        }
    }
    else
    {
        /* we're just a plain stack variable */
        gen_code_setlcl_stk();
    }
}